

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O2

Vec_Wec_t *
Acec_ManCollectCarryRootSets
          (Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vCarryMap,Vec_Int_t *vXors,Vec_Int_t *vXorRoots,
          Vec_Int_t *vCarryRoots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar4;
  Gia_Man_t *pGVar5;
  Gia_Man_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  Gia_Man_t *p_03;
  int iVar9;
  
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar4 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar4;
  pGVar5 = (Gia_Man_t *)Vec_IntAlloc(100);
  p_01 = (Gia_Man_t *)Vec_BitStart(p->nObjs);
  pVVar4 = Vec_IntAlloc(100);
  p_02 = Vec_IntStartFull(p->nObjs);
  iVar9 = 0;
  for (iVar7 = 0; iVar7 < vXors->nSize; iVar7 = iVar7 + 4) {
    iVar1 = Vec_IntEntry(vXors,iVar7);
    Vec_IntWriteEntry(p_02,iVar1,iVar9);
    iVar9 = iVar9 + 1;
  }
  for (iVar7 = 0; iVar7 < vCarryRoots->nSize; iVar7 = iVar7 + 1) {
    iVar9 = Vec_IntEntry(vCarryRoots,iVar7);
    Vec_BitWriteEntry((Vec_Bit_t *)p_01,iVar9,1);
  }
  iVar7 = 0;
  do {
    if (vXorRoots->nSize <= iVar7) {
      Vec_IntFree((Vec_Int_t *)pGVar5);
      Vec_IntFree(pVVar4);
      Vec_IntFree(p_02);
      for (iVar7 = 0; iVar7 < vCarryRoots->nSize; iVar7 = iVar7 + 1) {
        iVar9 = Vec_IntEntry(vCarryRoots,iVar7);
        pGVar5 = p_01;
        iVar1 = Vec_BitEntry((Vec_Bit_t *)p_01,iVar9);
        if ((iVar1 != 0) &&
           (iVar1 = Acec_ManCheckCarryMap(pGVar5,iVar9,vAdds,vCarryMap), iVar1 != 0)) {
          Vec_WecPushLevel(p_00);
          pVVar4 = Vec_WecPushLevel(p_00);
          Vec_IntGrow(pVVar4,1);
          *pVVar4->pArray = iVar9;
          pVVar4->nSize = 1;
          Vec_WecPushLevel(p_00);
          Vec_WecPushLevel(p_00);
          Vec_WecPushLevel(p_00);
        }
      }
      Vec_BitFree((Vec_Bit_t *)p_01);
      return p_00;
    }
    iVar9 = Vec_IntEntry(vXorRoots,iVar7);
    pVVar4->nSize = 0;
    *(int *)((long)&pGVar5->pName + 4) = 0;
    Gia_ManIncrementTravId(p);
    Acec_ManCountXorTreeInputs_rec(p,iVar9,vXors,p_02,(Vec_Bit_t *)p_01,(Vec_Int_t *)pGVar5,pVVar4);
    iVar9 = *(int *)((long)&pGVar5->pName + 4);
    iVar8 = 0;
    iVar1 = 0;
    if (0 < iVar9) {
      iVar1 = iVar9;
    }
    for (; iVar2 = iVar1, iVar1 != iVar8; iVar8 = iVar8 + 1) {
      p_03 = pGVar5;
      iVar2 = Vec_IntEntry((Vec_Int_t *)pGVar5,iVar8);
      iVar3 = Acec_ManCheckCarryMap(p_03,iVar2,vAdds,vCarryMap);
      iVar2 = iVar8;
      if (iVar3 != 0) break;
    }
    if (iVar2 != iVar9) {
      qsort(pGVar5->pSpec,(long)iVar9,4,Vec_IntSortCompare1);
      pVVar6 = Vec_WecPushLevel(p_00);
      Vec_IntAppend(pVVar6,pVVar4);
      pVVar6 = Vec_WecPushLevel(p_00);
      Vec_IntAppend(pVVar6,(Vec_Int_t *)pGVar5);
      Vec_WecPushLevel(p_00);
      Vec_WecPushLevel(p_00);
      Vec_WecPushLevel(p_00);
      for (iVar9 = 0; iVar1 != iVar9; iVar9 = iVar9 + 1) {
        iVar8 = Vec_IntEntry((Vec_Int_t *)pGVar5,iVar9);
        iVar2 = Vec_BitEntry((Vec_Bit_t *)p_01,iVar8);
        if (iVar2 == 0) {
          __assert_fail("Vec_BitEntry(vIsCarryRoot, CarryRoot)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecPool.c"
                        ,0x9b,
                        "Vec_Wec_t *Acec_ManCollectCarryRootSets(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        Vec_BitWriteEntry((Vec_Bit_t *)p_01,iVar8,0);
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Acec_ManCollectCarryRootSets( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vCarryMap, Vec_Int_t * vXors, Vec_Int_t * vXorRoots, Vec_Int_t * vCarryRoots )
{
    Vec_Wec_t * vCarryRootSets = Vec_WecAlloc( 100 ); // XorBoxes, CarryRoots, AdderBoxes, Ins/Ranks, Outs/Ranks
    Vec_Int_t * vCarryRootSet = Vec_IntAlloc( 100 );
    Vec_Bit_t * vIsCarryRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vXorSet = Vec_IntAlloc( 100 ), * vLevel;
    int i, k, XorRoot, CarryRoot;
    // map XORs into their cuts
    Vec_Int_t * vXorMap = Vec_IntStartFull( Gia_ManObjNum(p) );  
    for ( i = 0; 4*i < Vec_IntSize(vXors); i++ )
        Vec_IntWriteEntry( vXorMap, Vec_IntEntry(vXors, 4*i), i );
    // create carry root marks
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, i )
        Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 1 );
    // collect carry roots attached to each XOR root
    Vec_IntForEachEntry( vXorRoots, XorRoot, i )
    {
        Vec_IntClear( vXorSet );
        Vec_IntClear( vCarryRootSet );
        Gia_ManIncrementTravId( p );
        Acec_ManCountXorTreeInputs_rec( p, XorRoot, vXors, vXorMap, vIsCarryRoot, vCarryRootSet, vXorSet );
        // skip trivial
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
            if ( Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
                break;
        if ( k == Vec_IntSize(vCarryRootSet) )
            continue;
        Vec_IntSort( vCarryRootSet, 0 );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vXorSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntAppend( vLevel, vCarryRootSet );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        // unmark carry root set
        Vec_IntForEachEntry( vCarryRootSet, CarryRoot, k )
        {
            assert( Vec_BitEntry(vIsCarryRoot, CarryRoot) );
            Vec_BitWriteEntry( vIsCarryRoot, CarryRoot, 0 );
        }
    }
    Vec_IntFree( vCarryRootSet );
    Vec_IntFree( vXorSet );
    Vec_IntFree( vXorMap );
    // collect unmarked carry roots
    Vec_IntForEachEntry( vCarryRoots, CarryRoot, k )
    {
        if ( !Vec_BitEntry(vIsCarryRoot, CarryRoot) )
            continue;
        if ( !Acec_ManCheckCarryMap(p, CarryRoot, vAdds, vCarryMap) )
            continue;
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        Vec_IntFill( vLevel, 1, CarryRoot );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
        vLevel = Vec_WecPushLevel( vCarryRootSets );
    }
    Vec_BitFree( vIsCarryRoot );
    return vCarryRootSets;
}